

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase258::run(TestCase258 *this)

{
  bool bVar1;
  __pid_t _Var2;
  AsyncIoProvider *pAVar3;
  AsyncIoStream *pAVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Promise<unsigned_long> local_130;
  unsigned_long local_120;
  int local_118;
  bool local_111;
  undefined1 local_110 [7];
  bool _kj_shouldLog_2;
  Promise<void> local_100;
  String local_f0;
  bool local_d1;
  undefined1 local_d0 [7];
  bool _kj_shouldLog_1;
  Promise<unsigned_long> local_b8;
  unsigned_long local_a8;
  uint local_a0;
  bool local_99;
  undefined1 local_98 [7];
  bool _kj_shouldLog;
  char local_85 [4];
  Type local_81;
  undefined1 local_80 [3];
  char buf [4];
  undefined1 local_60 [8];
  PipeThread pipeThread;
  AsyncIoContext ioContext;
  TestCase258 *this_local;
  
  ioContext.unixEventPort = (UnixEventPort *)this;
  setupAsyncIo();
  pAVar3 = Own<kj::AsyncIoProvider>::operator->
                     ((Own<kj::AsyncIoProvider> *)&ioContext.lowLevelProvider.ptr);
  Function<void(kj::AsyncIoProvider&,kj::AsyncIoStream&,kj::WaitScope&)>::
  Function<kj::(anonymous_namespace)::TestCase258::run()::__0>
            ((Function<void(kj::AsyncIoProvider&,kj::AsyncIoStream&,kj::WaitScope&)> *)local_80,
             &local_81);
  (*pAVar3->_vptr_AsyncIoProvider[4])(local_60,pAVar3,local_80);
  Function<void_(kj::AsyncIoProvider_&,_kj::AsyncIoStream_&,_kj::WaitScope_&)>::~Function
            ((Function<void_(kj::AsyncIoProvider_&,_kj::AsyncIoStream_&,_kj::WaitScope_&)> *)
             local_80);
  pAVar4 = Own<kj::AsyncIoStream>::operator->((Own<kj::AsyncIoStream> *)&pipeThread.thread.ptr);
  (*(pAVar4->super_AsyncInputStream)._vptr_AsyncInputStream[1])(local_98,pAVar4,local_85,3,4);
  _Var2 = Promise<unsigned_long>::wait((Promise<unsigned_long> *)local_98,ioContext.provider.ptr);
  Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)local_98);
  if (CONCAT44(extraout_var,_Var2) != 3) {
    local_99 = _::Debug::shouldLog(ERROR);
    while (local_99 != false) {
      local_a0 = 3;
      pAVar4 = Own<kj::AsyncIoStream>::operator->((Own<kj::AsyncIoStream> *)&pipeThread.thread.ptr);
      (*(pAVar4->super_AsyncInputStream)._vptr_AsyncInputStream[1])(&local_b8,pAVar4,local_85,3,4);
      _Var2 = Promise<unsigned_long>::wait(&local_b8,ioContext.provider.ptr);
      local_a8 = CONCAT44(extraout_var_00,_Var2);
      _::Debug::log<char_const(&)[89],unsigned_int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++"
                 ,0x110,ERROR,
                 "\"failed: expected \" \"(3u) == (pipeThread.pipe->tryRead(buf, 3, 4).wait(ioContext.waitScope))\", 3u, pipeThread.pipe->tryRead(buf, 3, 4).wait(ioContext.waitScope)"
                 ,(char (*) [89])
                  "failed: expected (3u) == (pipeThread.pipe->tryRead(buf, 3, 4).wait(ioContext.waitScope))"
                 ,&local_a0,&local_a8);
      Promise<unsigned_long>::~Promise(&local_b8);
      local_99 = false;
    }
  }
  heapString((String *)local_d0,local_85,3);
  bVar1 = kj::operator==("foo",(String *)local_d0);
  String::~String((String *)local_d0);
  if (!bVar1) {
    local_d1 = _::Debug::shouldLog(ERROR);
    while (local_d1 != false) {
      heapString(&local_f0,local_85,3);
      _::Debug::log<char_const(&)[49],char_const(&)[4],kj::String>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++"
                 ,0x111,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (heapString(buf, 3))\", \"foo\", heapString(buf, 3)"
                 ,(char (*) [49])"failed: expected (\"foo\") == (heapString(buf, 3))",
                 (char (*) [4])0x654402,&local_f0);
      String::~String(&local_f0);
      local_d1 = false;
    }
  }
  pAVar4 = Own<kj::AsyncIoStream>::operator->((Own<kj::AsyncIoStream> *)&pipeThread.thread.ptr);
  (**(pAVar4->super_AsyncOutputStream)._vptr_AsyncOutputStream)
            (&local_100,&pAVar4->super_AsyncOutputStream,"bar",3);
  Promise<void>::wait(&local_100,ioContext.provider.ptr);
  Promise<void>::~Promise(&local_100);
  pAVar4 = Own<kj::AsyncIoStream>::operator->((Own<kj::AsyncIoStream> *)&pipeThread.thread.ptr);
  (*(pAVar4->super_AsyncInputStream)._vptr_AsyncInputStream[1])(local_110,pAVar4,local_85,1);
  _Var2 = Promise<unsigned_long>::wait((Promise<unsigned_long> *)local_110,ioContext.provider.ptr);
  Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)local_110);
  if (CONCAT44(extraout_var_01,_Var2) != 0) {
    local_111 = _::Debug::shouldLog(ERROR);
    while (local_111 != false) {
      local_118 = 0;
      pAVar4 = Own<kj::AsyncIoStream>::operator->((Own<kj::AsyncIoStream> *)&pipeThread.thread.ptr);
      (*(pAVar4->super_AsyncInputStream)._vptr_AsyncInputStream[1])(&local_130,pAVar4,local_85,1);
      _Var2 = Promise<unsigned_long>::wait(&local_130,ioContext.provider.ptr);
      local_120 = CONCAT44(extraout_var_02,_Var2);
      _::Debug::log<char_const(&)[88],int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++"
                 ,0x116,ERROR,
                 "\"failed: expected \" \"(0) == (pipeThread.pipe->tryRead(buf, 1, 1).wait(ioContext.waitScope))\", 0, pipeThread.pipe->tryRead(buf, 1, 1).wait(ioContext.waitScope)"
                 ,(char (*) [88])
                  "failed: expected (0) == (pipeThread.pipe->tryRead(buf, 1, 1).wait(ioContext.waitScope))"
                 ,&local_118,&local_120);
      Promise<unsigned_long>::~Promise(&local_130);
      local_111 = false;
    }
  }
  AsyncIoProvider::PipeThread::~PipeThread((PipeThread *)local_60);
  AsyncIoContext::~AsyncIoContext((AsyncIoContext *)&pipeThread.pipe.ptr);
  return;
}

Assistant:

TEST(AsyncIo, PipeThreadDisconnects) {
  // Like above, but in this case we expect the main thread to detect the pipe thread disconnecting.

  auto ioContext = setupAsyncIo();

  auto pipeThread = ioContext.provider->newPipeThread(
      [](AsyncIoProvider& ioProvider, AsyncIoStream& stream, WaitScope& waitScope) {
    char buf[4];
    stream.write("foo", 3).wait(waitScope);
    EXPECT_EQ(3u, stream.tryRead(buf, 3, 4).wait(waitScope));
    EXPECT_EQ("bar", heapString(buf, 3));
  });

  char buf[4];
  EXPECT_EQ(3u, pipeThread.pipe->tryRead(buf, 3, 4).wait(ioContext.waitScope));
  EXPECT_EQ("foo", heapString(buf, 3));

  pipeThread.pipe->write("bar", 3).wait(ioContext.waitScope);

  // Expect disconnect.
  EXPECT_EQ(0, pipeThread.pipe->tryRead(buf, 1, 1).wait(ioContext.waitScope));
}